

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void free_ParseTreeBelow(Parser *p,PNode *pn)

{
  uint32 *puVar1;
  PNode **__ptr;
  PNode *pPVar2;
  ulong uVar3;
  
  for (uVar3 = 0; __ptr = (pn->children).v, uVar3 < (pn->children).n; uVar3 = uVar3 + 1) {
    pPVar2 = __ptr[uVar3];
    puVar1 = &pPVar2->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pPVar2);
    }
  }
  if (__ptr != (pn->children).e && __ptr != (PNode **)0x0) {
    free(__ptr);
  }
  (pn->children).n = 0;
  (pn->children).v = (PNode **)0x0;
  pPVar2 = pn->ambiguities;
  if (pPVar2 != (PNode *)0x0) {
    pn->ambiguities = (PNode *)0x0;
    free_PNode(p,pPVar2);
    return;
  }
  return;
}

Assistant:

static void free_ParseTreeBelow(Parser *p, PNode *pn) {
  uint i;
  PNode *amb;

  for (i = 0; i < pn->children.n; i++) unref_pn(p, pn->children.v[i]);
  vec_free(&pn->children);
  if ((amb = pn->ambiguities)) {
    pn->ambiguities = NULL;
    free_PNode(p, amb);
  }
}